

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O2

int ForthToInt(Forth *forth)

{
  iterator iVar1;
  Forth *forth_local;
  
  forth_local = forth;
  iVar1 = std::
          _Rb_tree<const_cppforth::Forth_*,_std::pair<const_cppforth::Forth_*const,_int>,_std::_Select1st<std::pair<const_cppforth::Forth_*const,_int>_>,_std::less<const_cppforth::Forth_*>,_std::allocator<std::pair<const_cppforth::Forth_*const,_int>_>_>
          ::find(&Forth2Int._M_t,&forth_local);
  if ((_Rb_tree_header *)iVar1._M_node != &Forth2Int._M_t._M_impl.super__Rb_tree_header) {
    return *(int *)&iVar1._M_node[1]._M_parent;
  }
  __assert_fail("!\"wrong forth class instance is used\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp"
                ,0x69,"int ForthToInt(const cppforth::Forth *)");
}

Assistant:

int ForthToInt(const cppforth::Forth* forth){
	auto it=Forth2Int.find(forth);
	if (it != Forth2Int.end()){
		return it->second;
	}
	else {
		assert(!"wrong forth class instance is used");
		return 2;
	}
}